

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

HostVector<Real> *
amrex::sumToLine(HostVector<Real> *__return_storage_ptr__,MultiFab *mf,int icomp,int ncomp,
                Box *domain,int direction,bool local)

{
  pointer pdVar1;
  size_type sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  pointer pPVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  double *pdVar18;
  double *local_180;
  Array4<const_double> local_128;
  ulong local_e8;
  Vector<double_*,_std::allocator<double_*>_> pp;
  Box local_c4;
  Vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  other_hv;
  MFIter mfi;
  
  uVar17 = (((domain->bigend).vect[direction] - (domain->smallend).vect[direction]) + 1) * ncomp;
  PODVector<double,_std::allocator<double>_>::PODVector(__return_storage_ptr__,(long)(int)uVar17);
  pdVar1 = __return_storage_ptr__->m_data;
  sVar2 = __return_storage_ptr__->m_size;
  for (lVar10 = 0; sVar2 << 3 != lVar10; lVar10 = lVar10 + 8) {
    *(undefined8 *)((long)pdVar1 + lVar10) = 0;
  }
  std::
  vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  ::vector(&other_hv.
            super_vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
           ,0,(allocator_type *)&mfi);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&pp.super_vector<double_*,_std::allocator<double_*>_>,1,(allocator_type *)&mfi);
  if (pp.super_vector<double_*,_std::allocator<double_*>_>.
      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      pp.super_vector<double_*,_std::allocator<double_*>_>.
      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    *pp.super_vector<double_*,_std::allocator<double_*>_>.
     super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.super__Vector_impl_data.
     _M_start = __return_storage_ptr__->m_data;
  }
  local_e8 = (ulong)uVar17;
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,true);
  uVar3 = 0;
  if (0 < ncomp) {
    uVar3 = (ulong)(uint)ncomp;
  }
  lVar10 = (long)ncomp;
  lVar8 = (long)icomp << 3;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_c4,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_128,&mf->super_FabArray<amrex::FArrayBox>,&mfi);
    local_180 = *pp.super_vector<double_*,_std::allocator<double_*>_>.
                 super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    lVar16 = (long)local_c4.smallend.vect[0];
    lVar4 = (long)local_c4.smallend.vect[1];
    lVar5 = (long)local_c4.smallend.vect[2];
    lVar13 = (long)local_c4.bigend.vect[0];
    if (direction == 1) {
      lVar15 = lVar8;
      for (uVar6 = 0; lVar7 = lVar5, uVar6 != uVar3; uVar6 = uVar6 + 1) {
        for (; lVar12 = lVar4, (int)lVar7 <= local_c4.bigend.vect[2]; lVar7 = lVar7 + 1) {
          for (; lVar12 <= local_c4.bigend.vect[1]; lVar12 = lVar12 + 1) {
            pdVar18 = (double *)
                      ((long)local_128.p +
                      local_128.nstride * lVar15 +
                      (lVar12 - local_128.begin.y) * local_128.jstride * 8 +
                      (lVar7 - local_128.begin.z) * local_128.kstride * 8 +
                      (long)local_128.begin.x * -8 + lVar16 * 8);
            for (lVar9 = lVar16; lVar9 <= lVar13; lVar9 = lVar9 + 1) {
              local_180[uVar6 + lVar12 * lVar10] = *pdVar18 + local_180[uVar6 + lVar12 * lVar10];
              pdVar18 = pdVar18 + 1;
            }
          }
        }
        lVar15 = lVar15 + 8;
      }
    }
    else if (direction == 0) {
      local_180 = (double *)((long)local_180 + lVar10 * 8 * lVar16);
      lVar15 = lVar8;
      for (uVar6 = 0; lVar7 = lVar5, uVar6 != uVar3; uVar6 = uVar6 + 1) {
        for (; lVar12 = lVar4, (int)lVar7 <= local_c4.bigend.vect[2]; lVar7 = lVar7 + 1) {
          for (; (int)lVar12 <= local_c4.bigend.vect[1]; lVar12 = lVar12 + 1) {
            pdVar11 = (double *)
                      ((long)local_128.p +
                      local_128.nstride * lVar15 +
                      (lVar7 - local_128.begin.z) * local_128.kstride * 8 +
                      (lVar12 - local_128.begin.y) * local_128.jstride * 8 +
                      (long)local_128.begin.x * -8 + lVar16 * 8);
            pdVar18 = local_180;
            for (lVar9 = lVar16; lVar9 <= lVar13; lVar9 = lVar9 + 1) {
              *pdVar18 = *pdVar11 + *pdVar18;
              pdVar18 = pdVar18 + lVar10;
              pdVar11 = pdVar11 + 1;
            }
          }
        }
        local_180 = local_180 + 1;
        lVar15 = lVar15 + 8;
      }
    }
    else {
      lVar15 = lVar8;
      for (uVar6 = 0; lVar7 = lVar5, uVar6 != uVar3; uVar6 = uVar6 + 1) {
        for (; lVar7 <= local_c4.bigend.vect[2]; lVar7 = lVar7 + 1) {
          for (lVar12 = lVar4; (int)lVar12 <= local_c4.bigend.vect[1]; lVar12 = lVar12 + 1) {
            pdVar18 = (double *)
                      ((long)local_128.p +
                      local_128.nstride * lVar15 +
                      (lVar12 - local_128.begin.y) * local_128.jstride * 8 +
                      (lVar7 - local_128.begin.z) * local_128.kstride * 8 +
                      (long)local_128.begin.x * -8 + lVar16 * 8);
            for (lVar9 = lVar16; lVar9 <= lVar13; lVar9 = lVar9 + 1) {
              local_180[uVar6 + lVar7 * lVar10] = *pdVar18 + local_180[uVar6 + lVar7 * lVar10];
              pdVar18 = pdVar18 + 1;
            }
          }
        }
        lVar15 = lVar15 + 8;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  if (other_hv.
      super_vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
      .
      super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      other_hv.
      super_vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
      .
      super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    uVar3 = local_e8 & 0xffffffff;
    if ((int)local_e8 < 1) {
      uVar3 = uVar6;
    }
    for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      pdVar1 = __return_storage_ptr__->m_data;
      for (pPVar14 = other_hv.
                     super_vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
                     .
                     super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar14 !=
          other_hv.
          super_vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
          .
          super__Vector_base<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pPVar14 = pPVar14 + 1) {
        pdVar1[uVar6] = pPVar14->m_data[uVar6] + pdVar1[uVar6];
      }
    }
  }
  std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
            ((_Vector_base<double_*,_std::allocator<double_*>_> *)&pp);
  std::
  vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
  ::~vector(&other_hv.
             super_vector<amrex::PODVector<double,_std::allocator<double>_>,_std::allocator<amrex::PODVector<double,_std::allocator<double>_>_>_>
           );
  return __return_storage_ptr__;
}

Assistant:

Gpu::HostVector<Real> sumToLine (MultiFab const& mf, int icomp, int ncomp,
                                     Box const& domain, int direction, bool local)
    {
        int n1d = domain.length(direction) * ncomp;
        Gpu::HostVector<Real> hv(n1d);

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            Gpu::DeviceVector<Real> dv(domain.length(direction), Real(0.0));
            Real* p = dv.data();

            for (MFIter mfi(mf); mfi.isValid(); ++mfi) {
                Box const& b = mfi.validbox();
                const auto lo = amrex::lbound(b);
                const auto len = amrex::length(b);
                auto const& fab = mf.const_array(mfi);

                int n2d, n2dx;
                if (direction == 0) {
                    n2d = len.y * len.z;
                    n2dx = len.y;
                } else if (direction == 1) {
                    n2d = len.x * len.z;
                    n2dx = len.x;
                } else {
                    n2d = len.x * len.y;
                    n2dx = len.x;
                }
                int n2dblocks = (n2d+AMREX_GPU_MAX_THREADS-1)/AMREX_GPU_MAX_THREADS;
                int nblocks = n2dblocks * b.length(direction);
#ifdef AMREX_USE_DPCPP
                std::size_t shared_mem_byte = sizeof(Real)*Gpu::Device::warp_size;
                amrex::launch(nblocks, AMREX_GPU_MAX_THREADS, shared_mem_byte, Gpu::gpuStream(),
                              [=] AMREX_GPU_DEVICE (Gpu::Handler const& h) noexcept
#else
                amrex::launch(nblocks, AMREX_GPU_MAX_THREADS, Gpu::gpuStream(),
                              [=] AMREX_GPU_DEVICE () noexcept
#endif
                {
#ifdef AMREX_USE_DPCPP
                    int i1d = h.blockIdx() / n2dblocks;
                    int i2d = h.threadIdx() + h.blockDim()*(h.blockIdx()-i1d*n2dblocks);
#else
                    int i1d = blockIdx.x / n2dblocks;
                    int i2d = threadIdx.x + blockDim.x*(blockIdx.x-i1d*n2dblocks);
#endif
                    int i2dy = i2d / n2dx;
                    int i2dx = i2d - i2dy*n2dx;
                    int i, j, k, idir;
                    if (direction == 0) {
                        i = i1d  + lo.x;
                        j = i2dx + lo.y;
                        k = i2dy + lo.z;
                        idir = i;
                    } else if (direction == 1) {
                        i = i2dx + lo.x;
                        j = i1d  + lo.y;
                        k = i2dy + lo.z;
                        idir = j;
                    } else {
                        i = i2dx + lo.x;
                        j = i2dy + lo.y;
                        k = i1d  + lo.z;
                        idir = k;
                    }
                    for (int n = 0; n < ncomp; ++n) {
                        Real r = (i2d < n2d) ? fab(i,j,k,n+icomp) : Real(0.0);
#ifdef AMREX_USE_DPCPP
                        Gpu::deviceReduceSum_full(p+n+ncomp*idir, r, h);
#else
                        Gpu::deviceReduceSum_full(p+n+ncomp*idir, r);
#endif
                    }
                });
            }

            Gpu::copyAsync(Gpu::deviceToHost, dv.begin(), dv.end(), hv.begin());
            Gpu::streamSynchronize();
        }
        else
#endif
        {
            for (auto& x : hv) {
                x = Real(0.0);
            }

            Vector<Gpu::HostVector<Real> > other_hv(OpenMP::get_max_threads()-1);

            Vector<Real*> pp(OpenMP::get_max_threads());
            if (!pp.empty()) {
                pp[0] = hv.data();
            }
            for (int i = 1; i < OpenMP::get_max_threads(); ++i) {
                other_hv[i-1].resize(n1d, Real(0.0));
                pp[i] = other_hv[i-1].data();
            }

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
            for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                Box const& b = mfi.tilebox();
                auto const& fab = mf.const_array(mfi);
                Real * AMREX_RESTRICT p = pp[OpenMP::get_thread_num()];
                if (direction == 0) {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*i] += fab(i,j,k,n+icomp);
                    });
                } else if (direction == 1) {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*j] += fab(i,j,k,n+icomp);
                    });
                } else {
                    amrex::LoopOnCpu(b, ncomp, [&] (int i, int j, int k, int n) noexcept
                    {
                        p[n+ncomp*k] += fab(i,j,k,n+icomp);
                    });
                }
            }

            if (! other_hv.empty()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
                for (int i = 0; i < n1d; ++i) {
                    for (auto const& v : other_hv) {
                        hv[i] += v[i];
                    }
                }
            }
        }

        if (!local) {
            ParallelAllReduce::Sum(hv.data(), hv.size(), ParallelContext::CommunicatorSub());
        }
        return hv;
    }